

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O1

bool test_Player_getOwnedCountries(bool verbose)

{
  iterator iVar1;
  pointer ppCVar2;
  pointer pcVar3;
  vector<Map::Country*,std::allocator<Map::Country*>> *this;
  Hand *this_00;
  DiceRoller *this_01;
  Player *this_02;
  ostream *poVar4;
  pointer ppCVar5;
  pointer ppCVar6;
  pointer ppCVar7;
  Country *pCountry3;
  Country *pCountry2;
  Country *pCountry1;
  Country country3;
  Country country2;
  Country country1;
  Country *local_170;
  Country *local_168;
  long *local_160;
  long local_158;
  long local_150 [2];
  pointer local_140;
  pointer local_138;
  Player *local_130;
  Country *local_128;
  string local_120;
  string local_100;
  string local_e0;
  Country local_c0;
  Country local_90;
  Country local_60;
  
  this = (vector<Map::Country*,std::allocator<Map::Country*>> *)operator_new(0x18);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"country1","");
  Map::Country::Country(&local_60,0,&local_e0,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"country2","");
  Map::Country::Country(&local_90,1,&local_100,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"country3","");
  Map::Country::Country(&local_c0,3,&local_120,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  iVar1._M_current = *(Country ***)(this + 8);
  local_170 = &local_c0;
  local_168 = &local_90;
  local_128 = &local_60;
  if (iVar1._M_current == *(Country ***)(this + 0x10)) {
    std::vector<Map::Country*,std::allocator<Map::Country*>>::_M_realloc_insert<Map::Country*const&>
              (this,iVar1,&local_128);
  }
  else {
    *iVar1._M_current = &local_60;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  iVar1._M_current = *(Country ***)(this + 8);
  if (iVar1._M_current == *(Country ***)(this + 0x10)) {
    std::vector<Map::Country*,std::allocator<Map::Country*>>::_M_realloc_insert<Map::Country*const&>
              (this,iVar1,&local_168);
  }
  else {
    *iVar1._M_current = local_168;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  iVar1._M_current = *(Country ***)(this + 8);
  if (iVar1._M_current == *(Country ***)(this + 0x10)) {
    std::vector<Map::Country*,std::allocator<Map::Country*>>::_M_realloc_insert<Map::Country*const&>
              (this,iVar1,&local_170);
  }
  else {
    *iVar1._M_current = local_170;
    *(long *)(this + 8) = *(long *)(this + 8) + 8;
  }
  this_00 = (Hand *)operator_new(8);
  Hand::Hand(this_00);
  this_01 = (DiceRoller *)operator_new(0x10);
  DiceRoller::DiceRoller(this_01);
  this_02 = (Player *)operator_new(0x38);
  Player::Player(this_02,(vector<Map::Country_*,_std::allocator<Map::Country_*>_> *)this,this_00,
                 this_01,0);
  ppCVar7 = (this_02->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar5 = (this_02->pOwnedCountries->
            super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[35m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nThe player owns countries: ",0x1c);
    ppCVar6 = (this_02->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppCVar2 = (this_02->pOwnedCountries->
              super__Vector_base<Map::Country_*,_std::allocator<Map::Country_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_140 = ppCVar5;
    local_138 = ppCVar7;
    local_130 = this_02;
    if (ppCVar6 != ppCVar2) {
      do {
        pcVar3 = ((*ppCVar6)->cyName->_M_dataplus)._M_p;
        local_160 = local_150;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_160,pcVar3,pcVar3 + (*ppCVar6)->cyName->_M_string_length);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_160,local_158);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        if (local_160 != local_150) {
          operator_delete(local_160,local_150[0] + 1);
        }
        ppCVar6 = ppCVar6 + 1;
      } while (ppCVar6 != ppCVar2);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[31m",5);
    this_02 = local_130;
    ppCVar7 = local_138;
    ppCVar5 = local_140;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
  }
  Player::~Player(this_02);
  operator_delete(this_02,0x38);
  Map::Country::~Country(&local_c0);
  Map::Country::~Country(&local_90);
  Map::Country::~Country(&local_60);
  return ppCVar7 != ppCVar5;
}

Assistant:

bool test_Player_getOwnedCountries(bool verbose = false) {

    // Arrange
    bool success = true;
    auto* ownedCountries1 = new std::vector<Map::Country*>();
    Map::Country country1 = Map::Country(0, "country1", 0);
    Map::Country country2 = Map::Country(1, "country2", 0);
    Map::Country country3 = Map::Country(3, "country3", 1);
    Map::Country* pCountry1 = &country1;
    Map::Country* pCountry2 = &country2;
    Map::Country* pCountry3 = &country3;
    ownedCountries1->push_back(pCountry1);
    ownedCountries1->push_back(pCountry2);
    ownedCountries1->push_back(pCountry3);
    auto* cards = new Hand();
    auto* diceRoller = new DiceRoller();

    // Act
    auto* player1 = new Player(ownedCountries1, cards, diceRoller, 0);

    // Assert
    if (player1->getOwnedCountries()->empty()) {
        success = false;
    }
    if (verbose) {
        std::cout << "\033[35m";
        std::cout << "\nThe player owns countries: ";
        for (auto& i : *player1->getOwnedCountries()) {
            std::cout << i->getCountryName() << " ";
        }
        std::cout << "\033[31m" << std::endl;
    }
    delete player1;
    return success;
}